

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

void Str_ManNormalize_rec
               (Str_Ntk_t *pNtk,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Wec_t *vGroups,Vec_Int_t *vRoots)

{
  Gia_Obj_t *pObj_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  Str_Obj_t *pSVar5;
  Str_Ntk_t *pNtk_00;
  uint uVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  uint uVar9;
  char *__function;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  int t;
  ulong uVar13;
  ulong uVar14;
  char *__file;
  char *__assertion;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int t_1;
  int pFanins [3];
  uint local_64 [3];
  Str_Ntk_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Gia_Obj_t *local_40;
  uint local_34;
  
  if (pObj->Value == 0xffffffff) {
    pObj->Value = 0;
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar6 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar6 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x285,
                    "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                   );
    }
    pGVar11 = p->pObjs;
    if ((pObj < pGVar11) || (pGVar11 + p->nObjs <= pObj)) {
LAB_007d99e2:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    puVar4 = p->pMuxes;
    local_58 = pNtk;
    local_40 = pObj;
    if ((puVar4 != (uint *)0x0) &&
       (puVar4[(int)((ulong)((long)pObj - (long)pGVar11) >> 2) * -0x55555555] != 0)) {
      uVar9 = (int)((long)pObj - (long)pGVar11 >> 2) * -0x55555555;
      if (((int)uVar9 < 0) || (vRoots->nSize <= (int)uVar9)) {
LAB_007d98d3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar9 = vRoots->pArray[uVar9 & 0x7fffffff];
      uVar17 = (ulong)uVar9;
      if (uVar17 != 0xffffffff) {
        if (((int)uVar9 < 0) || (vGroups->nSize <= (int)uVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        local_48 = vGroups->pArray + uVar17;
        if (0 < vGroups->pArray[uVar17].nSize) {
          pVVar7 = (Vec_Int_t *)0x0;
          do {
            iVar1 = local_48->pArray[(long)pVVar7];
            if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_007d98b4;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            local_50 = pVVar7;
            Str_MuxInputsCollect(p,p->pObjs + iVar1,p->vSuper);
            pVVar7 = p->vSuper;
            pVVar10 = p->vStore;
            uVar6 = pVVar10->nSize;
            uVar17 = (ulong)uVar6;
            if (0 < pVVar7->nSize) {
              lVar16 = 0;
              do {
                Vec_IntPush(pVVar10,pVVar7->pArray[lVar16]);
                lVar16 = lVar16 + 1;
              } while (lVar16 < pVVar7->nSize);
            }
            pNtk = local_58;
            iVar1 = p->vStore->nSize;
            uVar9 = uVar6;
            while ((int)uVar9 < iVar1) {
              if (((int)uVar6 < 0) || (p->vStore->nSize <= (int)uVar17)) goto LAB_007d98d3;
              iVar2 = p->vStore->pArray[uVar17];
              if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_007d98b4;
              Str_ManNormalize_rec(pNtk,p,p->pObjs + iVar2,vGroups,vRoots);
              uVar17 = uVar17 + 1;
              uVar9 = (uint)uVar17;
            }
            if (p->vStore->nSize < (int)uVar6) goto LAB_007d99ac;
            p->vStore->nSize = uVar6;
            pVVar7 = (Vec_Int_t *)((long)&local_50->nCap + 1);
          } while ((long)pVVar7 < (long)local_48->nSize);
        }
        uVar6 = local_48->nSize;
        uVar17 = (ulong)uVar6;
        if (0 < (int)uVar6) {
          pVVar7 = &pNtk->vFanins;
          pVVar10 = (Vec_Int_t *)0x0;
          do {
            uVar6 = (uint)uVar17;
            iVar1 = local_48->pArray[(long)pVVar10];
            if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_007d98b4;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar11 = p->pObjs + iVar1;
            local_50 = pVVar10;
            Str_MuxStructCollect(p,pGVar11,p->vSuper);
            pVVar10 = p->vSuper;
            uVar6 = pVVar10->nSize;
            uVar17 = (ulong)uVar6;
            if (0 < (int)uVar6) {
              lVar16 = 0;
              do {
                uVar6 = (uint)uVar17;
                iVar1 = pVVar10->pArray[lVar16];
                if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_007d98b4;
                if (p->pObjs == (Gia_Obj_t *)0x0) break;
                pObj_00 = p->pObjs + iVar1;
                uVar17 = *(ulong *)pObj_00;
                if ((int)pObj_00[-(ulong)((uint)uVar17 & 0x1fffffff)].Value < 0) goto LAB_007d9911;
                uVar9 = (uint)(uVar17 >> 0x1d) & 1 ^
                        pObj_00[-(ulong)((uint)uVar17 & 0x1fffffff)].Value;
                uVar6 = (uint)(uVar17 >> 0x20);
                local_64[0] = uVar9;
                if ((int)pObj_00[-(ulong)(uVar6 & 0x1fffffff)].Value < 0) goto LAB_007d9911;
                uVar6 = pObj_00[-(ulong)(uVar6 & 0x1fffffff)].Value ^ uVar6 >> 0x1d & 1;
                local_64[1] = uVar6;
                local_64[2] = Gia_ObjFanin2Copy(p,pObj_00);
                if ((local_64[2] & 1) != 0) {
                  local_64[2] = local_64[2] & 0x7ffffffe;
                  local_64[0] = uVar6;
                  local_64[1] = uVar9;
                }
                iVar1 = local_58->nObjs;
                if (local_58->nObjsAlloc <= iVar1) goto LAB_007d994f;
                pSVar5 = local_58->pObjs;
                *(undefined4 *)(pSVar5 + iVar1) = 0x35;
                pSVar5[iVar1].iOffset = (local_58->vFanins).nSize;
                pSVar5[iVar1].iTop = -1;
                pSVar5[iVar1].iCopy = -1;
                lVar12 = 0;
                do {
                  uVar6 = local_64[lVar12];
                  Vec_IntPush(pVVar7,uVar6);
                  if ((int)uVar6 < 0) goto LAB_007d9895;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 3);
                local_58->nObjCount[5] = local_58->nObjCount[5] + 1;
                iVar1 = local_58->nObjs;
                local_58->nObjs = iVar1 + 1;
                if (iVar1 < 0) goto LAB_007d996e;
                pObj_00->Value = iVar1 * 2;
                lVar16 = lVar16 + 1;
                pVVar10 = p->vSuper;
                uVar6 = pVVar10->nSize;
                uVar17 = (ulong)(int)uVar6;
                pNtk = local_58;
              } while (lVar16 < (long)uVar17);
            }
            uVar9 = pGVar11->Value;
            if (uVar9 == 0xffffffff) {
              __assertion = "~pRoot->Value";
              __file = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
              ;
              __function = 
              "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
              ;
              goto LAB_007d99d8;
            }
            if (0 < (int)uVar6) {
              piVar8 = pVVar10->pArray;
              uVar17 = 0;
              do {
                iVar1 = piVar8[uVar17];
                if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_007d98b4;
                if (p->pObjs == (Gia_Obj_t *)0x0) break;
                if (((int)uVar9 < 0) || (uVar15 = p->pObjs[iVar1].Value, (int)uVar15 < 0))
                goto LAB_007d98f2;
                uVar15 = uVar15 >> 1;
                if (pNtk->nObjs <= (int)uVar15) goto LAB_007d9930;
                pNtk->pObjs[uVar15].iTop = uVar9 >> 1;
                uVar17 = uVar17 + 1;
              } while (uVar6 != uVar17);
            }
            pNtk->nTrees = pNtk->nTrees + 1;
            pVVar10 = (Vec_Int_t *)((long)&local_50->nCap + 1);
            uVar6 = local_48->nSize;
            uVar17 = (ulong)(int)uVar6;
          } while ((long)pVVar10 < (long)uVar17);
        }
        if (local_40->Value == 0xffffffff) {
          __assert_fail("~pObj->Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x2bd,
                        "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                       );
        }
        if ((int)uVar6 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
        }
        piVar8 = local_48->pArray;
        iVar1 = piVar8[(ulong)uVar6 - 1];
        if ((-1 < (long)iVar1) && (iVar2 = p->nObjs, iVar1 < iVar2)) {
          pGVar11 = p->pObjs;
          uVar17 = 0;
          do {
            iVar3 = piVar8[uVar17];
            if (((long)iVar3 < 0) || (iVar2 <= iVar3)) goto LAB_007d98b4;
            if (pGVar11 == (Gia_Obj_t *)0x0) break;
            if (((int)pGVar11[iVar1].Value < 0) || ((int)pGVar11[iVar3].Value < 0))
            goto LAB_007d98f2;
            uVar9 = pGVar11[iVar3].Value >> 1;
            if (pNtk->nObjs <= (int)uVar9) {
LAB_007d9930:
              __assert_fail("i < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                            ,0x52,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
            }
            pNtk->pObjs[uVar9].iTop = pGVar11[iVar1].Value >> 1;
            uVar17 = uVar17 + 1;
          } while (uVar6 != uVar17);
          pNtk->nGroups = pNtk->nGroups + 1;
          return;
        }
LAB_007d98b4:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Str_ManNormalize_rec(pNtk,p,pObj + -(ulong)uVar6,vGroups,vRoots);
      Str_ManNormalize_rec
                (pNtk,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vGroups,vRoots);
      if (p->pMuxes == (uint *)0x0) {
        pGVar11 = (Gia_Obj_t *)0x0;
      }
      else {
        pGVar11 = p->pObjs;
        if ((pObj < pGVar11) || (pGVar11 + p->nObjs <= pObj)) goto LAB_007d99e2;
        uVar6 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar11) >> 2) * -0x55555555];
        if ((int)uVar6 < 0) {
LAB_007d98f2:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar6 = uVar6 >> 1;
        if (p->nObjs <= (int)uVar6) goto LAB_007d98b4;
        pGVar11 = pGVar11 + uVar6;
      }
      Str_ManNormalize_rec(pNtk,p,pGVar11,vGroups,vRoots);
      uVar17 = *(ulong *)pObj;
      if (-1 < (int)pObj[-(ulong)((uint)uVar17 & 0x1fffffff)].Value) {
        uVar9 = (uint)(uVar17 >> 0x1d) & 1 ^ pObj[-(ulong)((uint)uVar17 & 0x1fffffff)].Value;
        uVar6 = (uint)(uVar17 >> 0x20);
        local_64[0] = uVar9;
        if (-1 < (int)pObj[-(ulong)(uVar6 & 0x1fffffff)].Value) {
          uVar6 = pObj[-(ulong)(uVar6 & 0x1fffffff)].Value ^ uVar6 >> 0x1d & 1;
          local_64[1] = uVar6;
          local_64[2] = Gia_ObjFanin2Copy(p,pObj);
          if ((local_64[2] & 1) != 0) {
            local_64[2] = local_64[2] & 0x7ffffffe;
            local_64[0] = uVar6;
            local_64[1] = uVar9;
          }
          iVar1 = pNtk->nObjs;
          if (iVar1 < pNtk->nObjsAlloc) {
            pSVar5 = pNtk->pObjs;
            *(undefined4 *)(pSVar5 + iVar1) = 0x35;
            pSVar5[iVar1].iOffset = (pNtk->vFanins).nSize;
            pSVar5[iVar1].iTop = -1;
            pSVar5[iVar1].iCopy = -1;
            lVar16 = 0;
            do {
              uVar6 = local_64[lVar16];
              Vec_IntPush(&pNtk->vFanins,uVar6);
              if ((int)uVar6 < 0) goto LAB_007d9895;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            local_58->nObjCount[5] = local_58->nObjCount[5] + 1;
            iVar1 = local_58->nObjs;
            local_58->nObjs = iVar1 + 1;
            if (-1 < iVar1) {
              pObj->Value = iVar1 * 2;
              return;
            }
            goto LAB_007d996e;
          }
          goto LAB_007d994f;
        }
      }
LAB_007d9911:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    if (p->vSuper == (Vec_Int_t *)0x0) {
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      pVVar7->nCap = 100;
      pVVar7->nSize = 0;
      piVar8 = (int *)malloc(400);
      pVVar7->pArray = piVar8;
      p->vSuper = pVVar7;
    }
    else {
      p->vSuper->nSize = 0;
    }
    uVar17 = *(ulong *)pObj;
    uVar6 = (uint)uVar17;
    if (((int)uVar6 < 0) || (uVar9 = uVar6 & 0x1fffffff, uVar9 == 0x1fffffff)) {
LAB_007d9a01:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x270,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar15 = (uint)(uVar17 >> 0x20) & 0x1fffffff;
    if ((uVar6 & 0x1fffffff) < uVar15) {
      if ((uVar17 & 0x2000000020000000) != 0) {
        __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x263,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
      }
      Gia_ManSuperCollectXor_rec(p,pObj + -(ulong)uVar9);
      Gia_ManSuperCollectXor_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
      qsort(p->vSuper->pArray,(long)p->vSuper->nSize,4,Vec_IntSortCompare1);
      Gia_ManSimplifyXor(p->vSuper);
    }
    else {
      if (((uVar6 & 0x1fffffff) <= uVar15) ||
         ((puVar4 != (uint *)0x0 &&
          (puVar4[(int)((ulong)((long)pObj - (long)pGVar11) >> 2) * -0x55555555] != 0))))
      goto LAB_007d9a01;
      Gia_ManSuperCollectAnd_rec
                (p,(Gia_Obj_t *)((ulong)(uVar6 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)uVar9)));
      uVar6 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
      Gia_ManSuperCollectAnd_rec
                (p,(Gia_Obj_t *)
                   ((ulong)(uVar6 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar6 & 0x1fffffff))));
      qsort(p->vSuper->pArray,(long)p->vSuper->nSize,4,Vec_IntSortCompare1);
      Gia_ManSimplifyAnd(p->vSuper);
    }
    pVVar7 = p->vSuper;
    local_50 = vRoots;
    if (pVVar7->nSize < 1) {
      __assert_fail("Vec_IntSize(p->vSuper) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x271,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
    }
    pVVar10 = p->vStore;
    uVar6 = pVVar10->nSize;
    uVar17 = (ulong)uVar6;
    lVar16 = 0;
    do {
      Vec_IntPush(pVVar10,pVVar7->pArray[lVar16]);
      pNtk_00 = local_58;
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar7->nSize);
    iVar1 = p->vStore->nSize;
    local_48 = (Vec_Int_t *)CONCAT44(local_48._4_4_,iVar1);
    local_34 = iVar1 - uVar6;
    uVar13 = uVar17;
    if (local_34 != 0 && (int)uVar6 <= iVar1) {
      do {
        if ((int)uVar6 < 0) goto LAB_007d98d3;
        if (p->vStore->nSize <= (int)uVar13) goto LAB_007d98d3;
        uVar9 = p->vStore->pArray[uVar13];
        if ((int)uVar9 < 0) goto LAB_007d98f2;
        if (p->nObjs <= (int)(uVar9 >> 1)) goto LAB_007d98b4;
        pGVar11 = p->pObjs;
        Str_ManNormalize_rec(pNtk_00,p,pGVar11 + (uVar9 >> 1),vGroups,local_50);
        uVar15 = pGVar11[uVar9 >> 1].Value;
        if ((int)uVar15 < 0) goto LAB_007d9911;
        if (p->vStore->nSize <= (int)uVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vStore->pArray[uVar13] = uVar15 ^ uVar9 & 1;
        uVar13 = uVar13 + 1;
      } while ((int)uVar13 < (int)local_48);
    }
    iVar1 = p->vStore->nSize;
    if (iVar1 != (int)local_48) {
      __assert_fail("Vec_IntSize(p->vStore) == iEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x2d3,
                    "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                   );
    }
    uVar9 = (uint)*(undefined8 *)local_40;
    uVar15 = 3;
    if ((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) {
      uVar15 = ((uVar9 & 0x1fffffff) < ((uint)((ulong)*(undefined8 *)local_40 >> 0x20) & 0x1fffffff)
               ) + 3;
    }
    if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    iVar1 = pNtk_00->nObjs;
    if (pNtk_00->nObjsAlloc <= iVar1) {
LAB_007d994f:
      __assert_fail("p->nObjs < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x70,"int Str_ObjCreate(Str_Ntk_t *, int, int, int *)");
    }
    piVar8 = p->vStore->pArray;
    pSVar5 = pNtk_00->pObjs;
    *(uint *)(pSVar5 + iVar1) = local_34 << 4 | uVar15;
    pSVar5[iVar1].iOffset = (pNtk_00->vFanins).nSize;
    pSVar5[iVar1].iTop = -1;
    pSVar5[iVar1].iCopy = -1;
    if (0 < (int)local_34) {
      pVVar7 = &local_58->vFanins;
      uVar13 = (ulong)local_34;
      uVar14 = 0;
      do {
        Vec_IntPush(pVVar7,piVar8[uVar17 + uVar14]);
        if (piVar8[uVar17 + uVar14] < 0) {
LAB_007d9895:
          __assert_fail("pFanins[i] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x78,"int Str_ObjCreate(Str_Ntk_t *, int, int, int *)");
        }
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    local_58->nObjCount[uVar15] = local_58->nObjCount[uVar15] + 1;
    iVar1 = local_58->nObjs;
    local_58->nObjs = iVar1 + 1;
    if (iVar1 < 0) {
LAB_007d996e:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    local_40->Value = iVar1 * 2;
    if (p->vStore->nSize < (int)uVar6) {
LAB_007d99ac:
      __assertion = "p->nSize >= nSizeNew";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
      ;
      __function = "void Vec_IntShrink(Vec_Int_t *, int)";
LAB_007d99d8:
      __assert_fail(__assertion,__file,0x2b7,__function);
    }
    p->vStore->nSize = uVar6;
  }
  return;
}

Assistant:

void Str_ManNormalize_rec( Str_Ntk_t * pNtk, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Wec_t * vGroups, Vec_Int_t * vRoots )
{
    int i, k, iVar, iLit, iBeg, iEnd;
    if ( ~pObj->Value )
        return;
    pObj->Value = 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsMux(p, pObj) )
    {
        Vec_Int_t * vGroup;
        Gia_Obj_t * pRoot, * pMux;
        int pFanins[3];
        if ( Vec_IntEntry(vRoots, Gia_ObjId(p, pObj)) == -1 )
        {
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin0(pObj), vGroups, vRoots );
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin1(pObj), vGroups, vRoots );
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin2(p, pObj), vGroups, vRoots );
            pFanins[0] = Gia_ObjFanin0Copy(pObj);
            pFanins[1] = Gia_ObjFanin1Copy(pObj);
            pFanins[2] = Gia_ObjFanin2Copy(p, pObj);
            if ( Abc_LitIsCompl(pFanins[2]) )
            {
                pFanins[2] = Abc_LitNot(pFanins[2]);
                ABC_SWAP( int, pFanins[0], pFanins[1] );
            }
            pObj->Value = Str_ObjCreate( pNtk, STR_MUX, 3, pFanins );
            return;
        }
        vGroup = Vec_WecEntry( vGroups, Vec_IntEntry(vRoots, Gia_ObjId(p, pObj)) );
        // build data-inputs for each tree
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
        {
            Str_MuxInputsCollect( p, pRoot, p->vSuper );
            iBeg = Vec_IntSize( p->vStore );
            Vec_IntAppend( p->vStore, p->vSuper );
            iEnd = Vec_IntSize( p->vStore );
            Vec_IntForEachEntryStartStop( p->vStore, iVar, k, iBeg, iEnd )
                Str_ManNormalize_rec( pNtk, p, Gia_ManObj(p, iVar), vGroups, vRoots );
            Vec_IntShrink( p->vStore, iBeg );
        }
        // build internal structures
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
        {
            Str_MuxStructCollect( p, pRoot, p->vSuper );
            Gia_ManForEachObjVec( p->vSuper, p, pMux, k )
            {
                pFanins[0] = Gia_ObjFanin0Copy(pMux);
                pFanins[1] = Gia_ObjFanin1Copy(pMux);
                pFanins[2] = Gia_ObjFanin2Copy(p, pMux);
                if ( Abc_LitIsCompl(pFanins[2]) )
                {
                    pFanins[2] = Abc_LitNot(pFanins[2]);
                    ABC_SWAP( int, pFanins[0], pFanins[1] );
                }
                pMux->Value = Str_ObjCreate( pNtk, STR_MUX, 3, pFanins );
            }
            assert( ~pRoot->Value );
            // set mapping
            Gia_ManForEachObjVec( p->vSuper, p, pMux, k )
                Str_NtkObj(pNtk, Abc_Lit2Var(pMux->Value))->iTop = Abc_Lit2Var(pRoot->Value);
            pNtk->nTrees++;
        }
        assert( ~pObj->Value );
        // set mapping
        pObj = Gia_ManObj( p, Vec_IntEntryLast(vGroup) );
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
            Str_NtkObj(pNtk, Abc_Lit2Var(pRoot->Value))->iTop = Abc_Lit2Var(pObj->Value);
        pNtk->nGroups++;
        //printf( "%d x %d  ", Vec_IntSize(vGroup), Vec_IntSize(p->vSuper) );
        return;
    }
    // find supergate
    Gia_ManSuperCollect( p, pObj );
    // save entries
    iBeg = Vec_IntSize( p->vStore );
    Vec_IntAppend( p->vStore, p->vSuper );
    iEnd = Vec_IntSize( p->vStore );
    // call recursively
    Vec_IntForEachEntryStartStop( p->vStore, iLit, i, iBeg, iEnd )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        Str_ManNormalize_rec( pNtk, p, pTemp, vGroups, vRoots );
        Vec_IntWriteEntry( p->vStore, i, Abc_LitNotCond(pTemp->Value, Abc_LitIsCompl(iLit)) );
    }
    assert( Vec_IntSize(p->vStore) == iEnd );
    // consider general case
    pObj->Value = Str_ObjCreate( pNtk, Gia_ObjIsXor(pObj) ? STR_XOR : STR_AND, iEnd-iBeg, Vec_IntEntryP(p->vStore, iBeg) );
    Vec_IntShrink( p->vStore, iBeg );
}